

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O1

QByteArray * __thiscall
QNetworkCookie::toRawForm(QByteArray *__return_storage_ptr__,QNetworkCookie *this,RawForm form)

{
  QNetworkCookiePrivate *pQVar1;
  QArrayData *pQVar2;
  char cVar3;
  uint uVar4;
  NetworkLayerProtocol NVar5;
  storage_type *psVar6;
  char cVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QStringView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QHostAddress hostAddr;
  QDateTime aQStack_78 [8];
  QLocale local_70 [8];
  QHostAddress local_68 [3];
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1->name).d.size != 0) {
    QByteArray::operator=(__return_storage_ptr__,&pQVar1->name);
    cVar7 = (char)__return_storage_ptr__;
    QByteArray::append(cVar7);
    QByteArray::append(__return_storage_ptr__);
    if (form == Full) {
      if (((this->d).d.ptr)->secure == true) {
        QVar9.m_data = (storage_type *)0x8;
        QVar9.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar9);
      }
      if (((this->d).d.ptr)->httpOnly == true) {
        QVar10.m_data = (storage_type *)0xa;
        QVar10.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar10);
      }
      if (((this->d).d.ptr)->sameSite != Default) {
        QVar11.m_data = (storage_type *)0xb;
        QVar11.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar11);
        uVar4 = ((this->d).d.ptr)->sameSite - None;
        psVar6 = (storage_type *)0x0;
        if (uVar4 < 3) {
          psVar6 = *(storage_type **)(&DAT_0025f770 + (ulong)uVar4 * 8);
        }
        QVar12.m_data = psVar6;
        QVar12.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar12);
      }
      cVar3 = QDateTime::isValid();
      if (cVar3 != '\0') {
        QVar13.m_data = (storage_type *)0xa;
        QVar13.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar13);
        QLocale::QLocale(local_70,1,0,0);
        QDateTime::toUTC();
        QVar8.m_data = (storage_type *)0x1e;
        QVar8.m_size = (qsizetype)local_50;
        QString::fromLatin1(QVar8);
        pQVar2 = local_50[0];
        QVar14.m_data = (storage_type_conflict *)aQStack_78;
        QVar14.m_size = (qsizetype)local_70;
        QLocale::toString((QDateTime *)local_68,QVar14);
        QString::toLatin1_helper_inplace((QString *)local_50);
        QByteArray::append(__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
        if (local_68[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
          LOCK();
          *(int *)local_68[0].d.d.ptr = *(int *)local_68[0].d.d.ptr + -1;
          UNLOCK();
          if (*(int *)local_68[0].d.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)local_68[0].d.d.ptr,2,0x10);
          }
        }
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        QDateTime::~QDateTime(aQStack_78);
        QLocale::~QLocale(local_70);
      }
      if ((((this->d).d.ptr)->domain).d.size != 0) {
        QVar15.m_data = (storage_type *)0x9;
        QVar15.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar15);
        cVar3 = QString::startsWith((QChar)((short)(this->d).d.ptr + L'\x10'),0x2e);
        if (cVar3 == '\0') {
          local_68[0].d.d.ptr =
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress(local_68,&((this->d).d.ptr)->domain);
          NVar5 = QHostAddress::protocol(local_68);
          if (NVar5 == IPv6Protocol) {
            QByteArray::append(cVar7);
            QString::toUtf8_helper((QString *)local_50);
            QByteArray::append(__return_storage_ptr__);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],1,0x10);
              }
            }
            QByteArray::append(cVar7);
          }
          else {
            QUrl::toAce(local_50,&((this->d).d.ptr)->domain,0);
            QByteArray::append(__return_storage_ptr__);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],1,0x10);
              }
            }
          }
          QHostAddress::~QHostAddress(local_68);
        }
        else {
          QByteArray::append(cVar7);
          QString::mid((longlong)local_68,(longlong)&((this->d).d.ptr)->domain);
          QUrl::toAce(local_50,local_68,0);
          QByteArray::append(__return_storage_ptr__);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],1,0x10);
            }
          }
          if (local_68[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
            LOCK();
            *(int *)local_68[0].d.d.ptr = *(int *)local_68[0].d.d.ptr + -1;
            UNLOCK();
            if (*(int *)local_68[0].d.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)local_68[0].d.d.ptr,2,0x10);
            }
          }
        }
      }
      if ((((this->d).d.ptr)->path).d.size != 0) {
        QVar16.m_data = (storage_type *)0x7;
        QVar16.m_size = (__return_storage_ptr__->d).size;
        QByteArray::insert((longlong)__return_storage_ptr__,QVar16);
        QString::toUtf8_helper((QString *)local_50);
        QByteArray::append(__return_storage_ptr__);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkCookie::toRawForm(RawForm form) const
{
    QByteArray result;
    if (d->name.isEmpty())
        return result;          // not a valid cookie

    result = d->name;
    result += '=';
    result += d->value;

    if (form == Full) {
        // same as above, but encoding everything back
        if (isSecure())
            result += "; secure";
        if (isHttpOnly())
            result += "; HttpOnly";
        if (d->sameSite != SameSite::Default) {
            result += "; SameSite=";
            result += sameSiteToRawString(d->sameSite);
        }
        if (!isSessionCookie()) {
            result += "; expires=";
            result += QLocale::c().toString(d->expirationDate.toUTC(),
                                            "ddd, dd-MMM-yyyy hh:mm:ss 'GMT"_L1).toLatin1();
        }
        if (!d->domain.isEmpty()) {
            result += "; domain=";
            if (d->domain.startsWith(u'.')) {
                result += '.';
                result += QUrl::toAce(d->domain.mid(1));
            } else {
                QHostAddress hostAddr(d->domain);
                if (hostAddr.protocol() == QAbstractSocket::IPv6Protocol) {
                    result += '[';
                    result += d->domain.toUtf8();
                    result += ']';
                } else {
                    result += QUrl::toAce(d->domain);
                }
            }
        }
        if (!d->path.isEmpty()) {
            result += "; path=";
            result += d->path.toUtf8();
        }
    }
    return result;
}